

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example.c
# Opt level: O0

int main(int argc,char **argv)

{
  char *__ptr;
  char *value;
  ctemplate_t *ctemplate;
  ctemplate_functions_t methods;
  undefined8 in_stack_ffffffffffffffb8;
  code *json;
  code *templateName;
  ctemplate_t *in_stack_ffffffffffffffe8;
  
  json = hash_set;
  templateName = hash_unset;
  ctemplate_init((char *)hash_get,(char *)hash_destroyMap,(ctemplate_functions_t *)hash_createMap,
                 SUB81((ulong)in_stack_ffffffffffffffb8 >> 0x38,0));
  __ptr = ctemplate_executeTemplate(in_stack_ffffffffffffffe8,(char *)templateName,(char *)json);
  printf("%s\n",__ptr);
  free(__ptr);
  ctemplate_destroy((ctemplate_t *)0x103454);
  return 0;
}

Assistant:

int main(int argc, char **argv) {
	ctemplate_functions_t methods;
	methods.createMap = hash_createMap;
	methods.destroyMap = hash_destroyMap;
	methods.get = hash_get;
	methods.set = hash_set;
	methods.unset = hash_unset;

	ctemplate_t *ctemplate = ctemplate_init(EXAMPLEPATH, NULL, &methods, 1);
	char *value = ctemplate_executeTemplate(ctemplate, "template.html", "{\"variable\":\"value\"}");
	printf("%s\n", value);
	free(value);
	ctemplate_destroy(ctemplate);
	return 0;
}